

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O0

TestStatus *
vkt::wsi::anon_unknown_0::resizeSurfaceTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  VkInstance instance;
  VkPhysicalDevice pVVar1;
  PtrData<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> data;
  PtrData<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> data_00;
  RefData<vk::Handle<(vk::HandleType)25>_> data_01;
  deUint32 dVar2;
  deUint32 dVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  qpTestResult code;
  TestContext *pTVar7;
  TestLog *log_00;
  Platform *pPVar8;
  undefined4 extraout_var;
  Display *pDVar9;
  VkInstance_s **ppVVar10;
  Window *pWVar11;
  size_type sVar12;
  const_reference ppVVar13;
  Handle<(vk::HandleType)25> *pHVar14;
  Vector<unsigned_int,_2> *value;
  Display *in_stack_fffffffffffffa78;
  undefined8 in_stack_fffffffffffffa80;
  bool local_551;
  string local_4b8;
  string local_498;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  deUint64 local_3f8;
  undefined1 local_3ec [8];
  VkSurfaceCapabilitiesKHR capabilities;
  ulong local_3b0;
  size_t deviceNdx;
  Exception *e;
  UVec2 testSize;
  int sizeNdx;
  UVec2 sizes [3];
  RefData<vk::Handle<(vk::HandleType)25>_> local_330;
  undefined1 local_310 [8];
  Unique<vk::Handle<(vk::HandleType)25>_> surface;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> physicalDevices;
  PtrData<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> local_2c8;
  PtrData<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *local_2b8;
  undefined1 local_2a8 [8];
  UniquePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> nativeWindow;
  undefined1 local_278 [8];
  UniquePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> nativeDisplay;
  InstanceHelper instHelper;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector results;
  TestLog *log;
  Type wsiType_local;
  Context *context_local;
  MovePtr *this;
  
  pTVar7 = Context::getTestContext(context);
  log_00 = tcu::TestContext::getLog(pTVar7);
  results.m_message.field_2._8_8_ = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,log_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)
             &nativeDisplay.
              super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.
              field_0x8,context,wsiType,(VkAllocationCallbacks *)0x0);
  pTVar7 = Context::getTestContext(context);
  pPVar8 = tcu::TestContext::getPlatform(pTVar7);
  iVar5 = (*pPVar8->_vptr_Platform[5])();
  this = (MovePtr *)CONCAT44(extraout_var,iVar5);
  createDisplay((MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)
                &nativeWindow.
                 super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.
                 field_0x8,(Platform *)this,
                (Extensions *)
                &nativeDisplay.
                 super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.
                 field_0x8,wsiType);
  de::details::MovePtr::operator_cast_to_PtrData
            ((PtrData<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)
             &nativeWindow.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8,this);
  data._8_8_ = in_stack_fffffffffffffa80;
  data.ptr = in_stack_fffffffffffffa78;
  de::details::UniquePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::UniquePtr
            ((UniquePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)local_278,data);
  de::details::MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::~MovePtr
            ((MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)
             &nativeWindow.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
              m_data.field_0x8);
  pDVar9 = de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::
           operator*((UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)
                     local_278);
  tcu::nothing<tcu::Vector<unsigned_int,2>>();
  createWindow((MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)&local_2c8,pDVar9,
               (Maybe<tcu::Vector<unsigned_int,_2>_> *)
               &physicalDevices.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_2b8 = de::details::MovePtr::operator_cast_to_PtrData(&local_2c8,(MovePtr *)pDVar9);
  data_00._8_8_ = in_stack_fffffffffffffa80;
  data_00.ptr = (Window *)in_stack_fffffffffffffa78;
  de::details::UniquePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::UniquePtr
            ((UniquePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)local_2a8,data_00);
  de::details::MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::~MovePtr
            ((MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)&local_2c8);
  tcu::Maybe<tcu::Vector<unsigned_int,_2>_>::~Maybe
            ((Maybe<tcu::Vector<unsigned_int,_2>_> *)
             &physicalDevices.
              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                       ((RefBase<vk::VkInstance_s_*> *)
                        &instHelper.supportedExtensions.
                         super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::enumeratePhysicalDevices
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             &surface.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_allocator,
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             *ppVVar10);
  ppVVar10 = ::vk::refdetails::RefBase<vk::VkInstance_s_*>::operator*
                       ((RefBase<vk::VkInstance_s_*> *)
                        &instHelper.supportedExtensions.
                         super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  instance = *ppVVar10;
  pDVar9 = de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::
           operator*((UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)
                     local_278);
  pWVar11 = de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::
            operator*((UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)local_2a8
                     );
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)(sizes + 2),
             (InstanceInterface *)
             &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator,
             instance,wsiType,pDVar9,pWVar11,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_330,(Move *)(sizes + 2));
  data_01.deleter.m_instanceIface = local_330.deleter.m_instanceIface;
  data_01.object.m_internal = local_330.object.m_internal;
  data_01.deleter.m_instance = local_330.deleter.m_instance;
  data_01.deleter.m_allocator = local_330.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_310,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)25>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)25>_> *)(sizes + 2));
  tcu::Vector<unsigned_int,_2>::Vector((Vector<unsigned_int,_2> *)(testSize.m_data + 1),0x40,0x40);
  tcu::Vector<unsigned_int,_2>::Vector(sizes,0x7c,0x77);
  tcu::Vector<unsigned_int,_2>::Vector(sizes + 1,0x100,0x200);
  for (testSize.m_data[0] = 0; (int)testSize.m_data[0] < 3;
      testSize.m_data[0] = testSize.m_data[0] + 1) {
    tcu::Vector<unsigned_int,_2>::Vector
              ((Vector<unsigned_int,_2> *)((long)&e + 4),
               (Vector<unsigned_int,_2> *)((&testSize)[(int)testSize.m_data[0]].m_data + 1));
    pWVar11 = de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::
              operator->((UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)
                         local_2a8);
    (*pWVar11->_vptr_Window[2])(pWVar11,(long)&e + 4);
    for (local_3b0 = 0;
        sVar12 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
                 size((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *
                      )&surface.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.
                        m_allocator), local_3b0 < sVar12; local_3b0 = local_3b0 + 1) {
      ppVVar13 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
                 operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                             *)&surface.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.
                                deleter.m_allocator,local_3b0);
      pVVar1 = *ppVVar13;
      pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_310);
      capabilities._44_8_ = pHVar14->m_internal;
      bVar4 = isSupportedByAnyQueue
                        ((InstanceInterface *)
                         &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
                          m_allocator,pVVar1,(VkSurfaceKHR)capabilities._44_8_);
      if (bVar4) {
        ppVVar13 = std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   ::operator[]((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                 *)&surface.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.
                                    deleter.m_allocator,local_3b0);
        pVVar1 = *ppVVar13;
        pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::operator*
                            ((RefBase<vk::Handle<(vk::HandleType)25>_> *)local_310);
        local_3f8 = pHVar14->m_internal;
        ::vk::wsi::getPhysicalDeviceSurfaceCapabilities
                  ((VkSurfaceCapabilitiesKHR *)local_3ec,
                   (InstanceInterface *)
                   &instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator
                   ,pVVar1,(VkSurfaceKHR)local_3f8);
        dVar2 = capabilities.minImageCount;
        uVar6 = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)((long)&e + 4));
        dVar3 = capabilities.maxImageCount;
        local_551 = false;
        if (dVar2 == uVar6) {
          uVar6 = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)((long)&e + 4));
          local_551 = dVar3 == uVar6;
        }
        de::toString<vk::VkExtent2D>(&local_478,(VkExtent2D *)&capabilities);
        std::operator+(&local_458,"currentExtent ",&local_478);
        std::operator+(&local_438,&local_458," doesn\'t match requested size ");
        de::toString<tcu::Vector<unsigned_int,2>>(&local_498,(de *)((long)&e + 4),value);
        std::operator+(&local_418,&local_438,&local_498);
        tcu::ResultCollector::check((ResultCollector *)local_78,local_551,&local_418);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::string::~string((string *)&local_498);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_478);
      }
    }
  }
  code = tcu::ResultCollector::getResult((ResultCollector *)local_78);
  tcu::ResultCollector::getMessage_abi_cxx11_(&local_4b8,(ResultCollector *)local_78);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)25>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)25>_> *)local_310);
  std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::~vector
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             &surface.super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_allocator);
  de::details::UniquePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::~UniquePtr
            ((UniquePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)local_2a8);
  de::details::UniquePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::~UniquePtr
            ((UniquePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)local_278);
  InstanceHelper::~InstanceHelper
            ((InstanceHelper *)
             &nativeDisplay.
              super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.
              field_0x8);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus resizeSurfaceTest (Context& context, Type wsiType)
{
	tcu::TestLog&					log				= context.getTestContext().getLog();
	tcu::ResultCollector			results			(log);

	const InstanceHelper			instHelper		(context, wsiType);

	const UniquePtr<Display>		nativeDisplay	(createDisplay(context.getTestContext().getPlatform().getVulkanPlatform(),
																   instHelper.supportedExtensions,
																   wsiType));
	UniquePtr<Window>				nativeWindow	(createWindow(*nativeDisplay, tcu::nothing<UVec2>()));

	const vector<VkPhysicalDevice>	physicalDevices	= enumeratePhysicalDevices(instHelper.vki, *instHelper.instance);
	const Unique<VkSurfaceKHR>		surface			(createSurface(instHelper.vki, *instHelper.instance, wsiType, *nativeDisplay, *nativeWindow));

	const UVec2						sizes[]			=
	{
		UVec2(64, 64),
		UVec2(124, 119),
		UVec2(256, 512)
	};

	DE_ASSERT(getPlatformProperties(wsiType).features & PlatformProperties::FEATURE_RESIZE_WINDOW);

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); ++sizeNdx)
	{
		const UVec2		testSize	= sizes[sizeNdx];

		try
		{
			nativeWindow->resize(testSize);
		}
		catch (const tcu::Exception& e)
		{
			// Make sure all exception types result in a test failure
			results.fail(e.getMessage());
		}

		for (size_t deviceNdx = 0; deviceNdx < physicalDevices.size(); ++deviceNdx)
		{
			if (isSupportedByAnyQueue(instHelper.vki, physicalDevices[deviceNdx], *surface))
			{
				const VkSurfaceCapabilitiesKHR	capabilities	= getPhysicalDeviceSurfaceCapabilities(instHelper.vki, physicalDevices[deviceNdx], *surface);

				// \note Assumes that surface size is NOT set by swapchain if initial window size is honored by platform
				results.check(capabilities.currentExtent.width == testSize.x() &&
								capabilities.currentExtent.height == testSize.y(),
								"currentExtent " + de::toString(capabilities.currentExtent) + " doesn't match requested size " + de::toString(testSize));
			}
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}